

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<3>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  float fVar1;
  bool bVar2;
  qpTestResult qVar3;
  float (*pafVar4) [9];
  TestLog *this;
  MessageBuilder *pMVar5;
  int local_24c;
  MessageBuilder local_228;
  int local_a8;
  int local_a4;
  int stateIndex;
  int refIndex;
  int x;
  int y;
  StateQueryMemoryWriteGuard<float[9]> state;
  bool transpose_local;
  GLfloat *values_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[7]._3_1_ = transpose;
  unique0x10000258 = values;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[9]> *)&x);
  pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&x);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,*pafVar4);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[9]> *)&x,testCtx);
  if (bVar2) {
    for (refIndex = 0; refIndex < 3; refIndex = refIndex + 1) {
      for (stateIndex = 0; stateIndex < 3; stateIndex = stateIndex + 1) {
        local_a4 = refIndex * 3 + stateIndex;
        if ((state.m_postguard[7]._3_1_ & 1) == 0) {
          local_24c = refIndex * 3 + stateIndex;
        }
        else {
          local_24c = stateIndex * 3 + refIndex;
        }
        local_a8 = local_24c;
        fVar1 = stack0xffffffffffffffd8[local_a4];
        pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&x);
        if ((fVar1 != (*pafVar4)[local_a8]) || (NAN(fVar1) || NAN((*pafVar4)[local_a8]))) {
          this = tcu::TestContext::getLog(testCtx);
          tcu::TestLog::operator<<(&local_228,this,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [21])"// ERROR: at index [")
          ;
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&refIndex);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])"][");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stateIndex);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"] expected ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,stack0xffffffffffffffd8 + local_a4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2b8b5f6);
          pafVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&x);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,*pafVar4 + local_a8);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_228);
          qVar3 = tcu::TestContext::getTestResult(testCtx);
          if (qVar3 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}